

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  void *pvVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ostream *poVar9;
  long in_RSI;
  int in_EDI;
  string space;
  string residual_characters;
  int index;
  ostringstream stored_characters;
  uint8_t data;
  istream *input_stream;
  ostringstream error_message_5;
  ifstream ifs;
  ostringstream error_message_4;
  char *input_file;
  ostringstream error_message_3;
  int num_input_files;
  ostringstream error_message_2;
  int tmp;
  int max;
  int min;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  AddressFormats address_format;
  int num_column;
  int start_index;
  option *in_stack_ffffffffffffef08;
  istream *in_stack_ffffffffffffef10;
  string *in_stack_ffffffffffffef18;
  undefined8 in_stack_ffffffffffffef20;
  ostream *in_stack_ffffffffffffef30;
  char *local_fc8;
  char *local_f80;
  byte local_f32;
  bool local_f0a;
  ostringstream *in_stack_fffffffffffff0f8;
  allocator *in_stack_fffffffffffff100;
  bool local_eda;
  allocator local_eb9;
  string local_eb8 [32];
  string local_e98 [39];
  allocator local_e71;
  string local_e70 [32];
  string local_e50 [36];
  int local_e2c;
  char local_e25;
  int local_e24;
  char local_e1d;
  int local_e1c;
  char local_e15;
  int local_e14;
  char local_e0d;
  int local_e0c;
  ostringstream local_e08 [383];
  byte local_c89;
  char *local_c88;
  undefined4 local_c80;
  allocator local_c79;
  string local_c78 [32];
  ostringstream local_c58 [376];
  char local_ae0 [527];
  allocator local_8d1;
  string local_8d0 [32];
  ostringstream local_8b0 [376];
  char *local_738;
  allocator local_729;
  string local_728 [32];
  ostringstream local_708 [376];
  int local_590;
  allocator local_589;
  string local_588 [32];
  ostringstream local_568 [383];
  allocator local_3e9;
  string local_3e8 [32];
  int local_3c8;
  undefined4 local_3c4;
  undefined4 local_3c0;
  allocator local_3b9;
  string local_3b8 [32];
  ostringstream local_398 [383];
  allocator local_219;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [32];
  ostringstream local_1d0 [399];
  allocator local_41;
  string local_40 [32];
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0;
  local_18 = 0x10;
  local_1c = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_20 = ya_getopt_long((int)((ulong)in_stack_ffffffffffffef20 >> 0x20),
                                   (char **)in_stack_ffffffffffffef18,
                                   (char *)in_stack_ffffffffffffef10,in_stack_ffffffffffffef08,
                                   (int *)0x103735), pcVar1 = ya_optarg, local_20 != -1) {
    switch(local_20) {
    case 99:
      in_stack_fffffffffffff100 = &local_219;
      in_stack_fffffffffffff0f8 = (ostringstream *)ya_optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_218,(char *)in_stack_fffffffffffff0f8,in_stack_fffffffffffff100);
      bVar2 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffef18,(int *)in_stack_ffffffffffffef10);
      local_f0a = !bVar2 || local_18 < 1;
      std::__cxx11::string::~string(local_218);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
      if (local_f0a) {
        std::__cxx11::ostringstream::ostringstream(local_398);
        std::operator<<((ostream *)local_398,
                        "The argument for the -c option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3b8,"fd",&local_3b9);
        sptk::PrintErrorMessage((string *)in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
        std::__cxx11::string::~string(local_3b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_398);
        return local_4;
      }
      break;
    default:
      anon_unknown.dwarf_9c3::PrintUsage(in_stack_ffffffffffffef30);
      return 1;
    case 0x68:
      anon_unknown.dwarf_9c3::PrintUsage(in_stack_ffffffffffffef30);
      return 0;
    case 0x6f:
      local_3c0 = 0;
      local_3c4 = 3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3e8,pcVar1,&local_3e9);
      bVar2 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffef18,(int *)in_stack_ffffffffffffef10);
      local_f32 = 1;
      if (bVar2) {
        bVar2 = sptk::IsInRange(local_3c8,0,3);
        local_f32 = bVar2 ^ 0xff;
      }
      std::__cxx11::string::~string(local_3e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
      if ((local_f32 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_568);
        poVar9 = std::operator<<((ostream *)local_568,
                                 "The argument for the -o option must be an integer ");
        poVar9 = std::operator<<(poVar9,"in the range of ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,0);
        poVar9 = std::operator<<(poVar9," to ");
        std::ostream::operator<<(poVar9,3);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_588,"fd",&local_589);
        sptk::PrintErrorMessage((string *)in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
        std::__cxx11::string::~string(local_588);
        std::allocator<char>::~allocator((allocator<char> *)&local_589);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_568);
        return local_4;
      }
      local_1c = local_3c8;
      break;
    case 0x73:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,pcVar1,&local_41);
      bVar2 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffef18,(int *)in_stack_ffffffffffffef10);
      local_eda = !bVar2 || local_14 < 0;
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      if (local_eda) {
        std::__cxx11::ostringstream::ostringstream(local_1d0);
        poVar9 = std::operator<<((ostream *)local_1d0,"The argument for the -s option must be a ");
        std::operator<<(poVar9,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f0,"fd",&local_1f1);
        sptk::PrintErrorMessage((string *)in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
        std::__cxx11::string::~string(local_1f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1d0);
        return local_4;
      }
    }
  }
  local_590 = local_8 - ya_optind;
  if (1 < local_590) {
    std::__cxx11::ostringstream::ostringstream(local_708);
    std::operator<<((ostream *)local_708,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_728,"fd",&local_729);
    sptk::PrintErrorMessage((string *)in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
    std::__cxx11::string::~string(local_728);
    std::allocator<char>::~allocator((allocator<char> *)&local_729);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_708);
    return local_4;
  }
  if (local_590 == 0) {
    local_f80 = (char *)0x0;
  }
  else {
    local_f80 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_738 = local_f80;
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_8b0);
    std::operator<<((ostream *)local_8b0,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8d0,"fd",&local_8d1);
    sptk::PrintErrorMessage((string *)in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
    std::__cxx11::string::~string(local_8d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_8b0);
    return local_4;
  }
  std::ifstream::ifstream(local_ae0);
  pcVar1 = local_738;
  if (local_738 != (char *)0x0) {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_ae0,(_Ios_Openmode)pcVar1);
    bVar3 = std::ios::fail();
    if ((bVar3 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_c58);
      poVar9 = std::operator<<((ostream *)local_c58,"Cannot open file ");
      std::operator<<(poVar9,local_738);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c78,"fd",&local_c79);
      sptk::PrintErrorMessage((string *)in_stack_fffffffffffff100,in_stack_fffffffffffff0f8);
      std::__cxx11::string::~string(local_c78);
      std::allocator<char>::~allocator((allocator<char> *)&local_c79);
      local_4 = 1;
      local_c80 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_c58);
      goto LAB_00104b61;
    }
  }
  bVar3 = std::ifstream::is_open();
  if ((bVar3 & 1) == 0) {
    local_fc8 = (char *)&std::cin;
  }
  else {
    local_fc8 = local_ae0;
  }
  local_c88 = local_fc8;
  std::__cxx11::ostringstream::ostringstream(local_e08);
  local_e0c = local_14;
  while (bVar2 = sptk::ReadStream<unsigned_char>
                           ((uchar *)in_stack_ffffffffffffef18,in_stack_ffffffffffffef10), bVar2) {
    if ((local_e0c - local_14) % local_18 == 0) {
      switch(local_1c) {
      case 0:
        break;
      case 1:
        local_e0d = (char)std::setfill<char>('0');
        poVar9 = std::operator<<(&std::cout,local_e0d);
        local_e14 = (int)std::setw(6);
        poVar9 = std::operator<<(poVar9,(_Setw)local_e14);
        pvVar5 = (void *)std::ostream::operator<<(poVar9,std::hex);
        poVar9 = (ostream *)std::ostream::operator<<(pvVar5,local_e0c);
        std::operator<<(poVar9,"  ");
        break;
      case 2:
        local_e15 = (char)std::setfill<char>('0');
        poVar9 = std::operator<<(&std::cout,local_e15);
        local_e1c = (int)std::setw(6);
        poVar9 = std::operator<<(poVar9,(_Setw)local_e1c);
        pvVar5 = (void *)std::ostream::operator<<(poVar9,std::dec);
        poVar9 = (ostream *)std::ostream::operator<<(pvVar5,local_e0c);
        std::operator<<(poVar9,"  ");
        break;
      case 3:
        local_e1d = (char)std::setfill<char>('0');
        poVar9 = std::operator<<(&std::cout,local_e1d);
        local_e24 = (int)std::setw(6);
        poVar9 = std::operator<<(poVar9,(_Setw)local_e24);
        pvVar5 = (void *)std::ostream::operator<<(poVar9,std::oct);
        poVar9 = (ostream *)std::ostream::operator<<(pvVar5,local_e0c);
        std::operator<<(poVar9,"  ");
      }
    }
    iVar4 = isprint((uint)local_c89);
    if (iVar4 == 0) {
      std::operator<<((ostream *)local_e08,".");
    }
    else {
      std::operator<<((ostream *)local_e08,local_c89);
    }
    local_e25 = (char)std::setfill<char>('0');
    poVar9 = std::operator<<(&std::cout,local_e25);
    local_e2c = (int)std::setw(2);
    poVar9 = std::operator<<(poVar9,(_Setw)local_e2c);
    pvVar5 = (void *)std::ostream::operator<<(poVar9,std::hex);
    poVar9 = (ostream *)std::ostream::operator<<(pvVar5,(uint)local_c89);
    std::operator<<(poVar9," ");
    if (local_18 + -1 == (local_e0c - local_14) % local_18) {
      poVar9 = std::operator<<((ostream *)&std::cout,"|");
      std::__cxx11::ostringstream::str();
      poVar9 = std::operator<<(poVar9,local_e50);
      std::operator<<(poVar9,"|\n");
      std::__cxx11::string::~string(local_e50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e70,"",&local_e71);
      std::__cxx11::ostringstream::str((string *)local_e08);
      std::__cxx11::string::~string(local_e70);
      std::allocator<char>::~allocator((allocator<char> *)&local_e71);
    }
    local_e0c = local_e0c + 1;
  }
  std::__cxx11::ostringstream::str();
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    lVar7 = (long)local_18;
    lVar8 = std::__cxx11::string::size();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_eb8,(lVar7 - lVar8) * 3,' ',&local_eb9);
    std::allocator<char>::~allocator((allocator<char> *)&local_eb9);
    poVar9 = std::operator<<((ostream *)&std::cout,local_eb8);
    poVar9 = std::operator<<(poVar9,"|");
    poVar9 = std::operator<<(poVar9,local_e98);
    poVar9 = std::operator<<(poVar9,"|");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_eb8);
  }
  local_4 = 0;
  local_c80 = 1;
  std::__cxx11::string::~string(local_e98);
  std::__cxx11::ostringstream::~ostringstream(local_e08);
LAB_00104b61:
  std::ifstream::~ifstream(local_ae0);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int start_index(kDefaultStartIndex);
  int num_column(kDefaultNumColumn);
  AddressFormats address_format(kDefaultAddressFormat);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "s:c:o:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 's': {
        if (!sptk::ConvertStringToInteger(optarg, &start_index) ||
            start_index < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("fd", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        if (!sptk::ConvertStringToInteger(optarg, &num_column) ||
            num_column <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -c option must be a positive integer";
          sptk::PrintErrorMessage("fd", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumAddressFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("fd", error_message);
          return 1;
        }
        address_format = static_cast<AddressFormats>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("fd", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("fd", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("fd", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  std::uint8_t data;
  std::ostringstream stored_characters;

  for (int index(start_index); sptk::ReadStream(&data, &input_stream);
       ++index) {
    // Output address.
    if (0 == (index - start_index) % num_column) {
      switch (address_format) {
        case kNone: {
          // nothing to do
          break;
        }
        case kHexadecimal: {
          std::cout << std::setfill('0') << std::setw(6) << std::hex << index
                    << "  ";
          break;
        }
        case kDecimal: {
          std::cout << std::setfill('0') << std::setw(6) << std::dec << index
                    << "  ";
          break;
        }
        case kOctal: {
          std::cout << std::setfill('0') << std::setw(6) << std::oct << index
                    << "  ";
          break;
        }
        default: {
          break;
        }
      }
    }

    // Stack human-readable characters.
    if (std::isprint(data)) {
      stored_characters << data;
    } else {
      stored_characters << ".";
    }

    // Output data.
    std::cout << std::setfill('0') << std::setw(2) << std::hex
              << static_cast<int>(data) << " ";

    // Output new line.
    if (num_column - 1 == (index - start_index) % num_column) {
      std::cout << "|" << stored_characters.str() << "|\n";
      stored_characters.str("");  // Clear.
    }
  }

  // Flush.
  const std::string residual_characters(stored_characters.str());
  if (!residual_characters.empty()) {
    const std::string space(3 * (num_column - residual_characters.size()), ' ');
    std::cout << space << "|" << residual_characters << "|" << std::endl;
  }

  return 0;
}